

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_ctl.c
# Opt level: O0

void line_tilde_dsp(t_line *x,t_signal **sp)

{
  t_signal **sp_local;
  t_line *x_local;
  
  if (((*sp)->s_n & 7U) == 0) {
    dsp_add(line_tilde_perf8,3,x,(*sp)->s_vec,(long)(*sp)->s_n);
  }
  else {
    dsp_add(line_tilde_perform,3,x,(*sp)->s_vec,(long)(*sp)->s_n);
  }
  x->x_1overn = 1.0 / (float)(*sp)->s_n;
  x->x_dspticktomsec = (*sp)->s_sr / (float)((*sp)->s_n * 1000);
  return;
}

Assistant:

static void line_tilde_dsp(t_line *x, t_signal **sp)
{
    if(sp[0]->s_n&7)
        dsp_add(line_tilde_perform, 3, x, sp[0]->s_vec, (t_int)sp[0]->s_n);
    else
        dsp_add(line_tilde_perf8, 3, x, sp[0]->s_vec, (t_int)sp[0]->s_n);
    x->x_1overn = 1./sp[0]->s_n;
    x->x_dspticktomsec = sp[0]->s_sr / (1000 * sp[0]->s_n);
}